

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkPipelineColorBlendAttachmentState *
Diligent::RenderTargetBlendDescToVkColorBlendAttachmentState
          (VkPipelineColorBlendAttachmentState *__return_storage_ptr__,
          RenderTargetBlendDesc *RTBlendDesc)

{
  VkBlendFactor VVar1;
  VkBlendOp VVar2;
  
  if (RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)::
      BFtoVKBF == '\0') {
    RenderTargetBlendDescToVkColorBlendAttachmentState();
  }
  if (RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)::
      BOtoVKBO == '\0') {
    RenderTargetBlendDescToVkColorBlendAttachmentState();
  }
  __return_storage_ptr__->blendEnable = (uint)RTBlendDesc->BlendEnable;
  VVar1 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->SrcBlend);
  __return_storage_ptr__->srcColorBlendFactor = VVar1;
  VVar1 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->DestBlend);
  __return_storage_ptr__->dstColorBlendFactor = VVar1;
  VVar2 = BlendOperationToVkBlendOp::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BOtoVKBO,
                     RTBlendDesc->BlendOp);
  __return_storage_ptr__->colorBlendOp = VVar2;
  VVar1 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->SrcBlendAlpha);
  __return_storage_ptr__->srcAlphaBlendFactor = VVar1;
  VVar1 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->DestBlendAlpha);
  __return_storage_ptr__->dstAlphaBlendFactor = VVar1;
  VVar2 = BlendOperationToVkBlendOp::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BOtoVKBO,
                     RTBlendDesc->BlendOpAlpha);
  __return_storage_ptr__->alphaBlendOp = VVar2;
  __return_storage_ptr__->colorWriteMask = RTBlendDesc->RenderTargetWriteMask & 0xf;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineColorBlendAttachmentState RenderTargetBlendDescToVkColorBlendAttachmentState(const RenderTargetBlendDesc& RTBlendDesc)
{
    static const BlendFactorToVkBlendFactorMapper BFtoVKBF;
    static const BlendOperationToVkBlendOp        BOtoVKBO;
    VkPipelineColorBlendAttachmentState           AttachmentBlendState = {};

    AttachmentBlendState.blendEnable         = RTBlendDesc.BlendEnable;
    AttachmentBlendState.srcColorBlendFactor = BFtoVKBF[RTBlendDesc.SrcBlend];
    AttachmentBlendState.dstColorBlendFactor = BFtoVKBF[RTBlendDesc.DestBlend];
    AttachmentBlendState.colorBlendOp        = BOtoVKBO[RTBlendDesc.BlendOp];
    AttachmentBlendState.srcAlphaBlendFactor = BFtoVKBF[RTBlendDesc.SrcBlendAlpha];
    AttachmentBlendState.dstAlphaBlendFactor = BFtoVKBF[RTBlendDesc.DestBlendAlpha];
    AttachmentBlendState.alphaBlendOp        = BOtoVKBO[RTBlendDesc.BlendOpAlpha];
    AttachmentBlendState.colorWriteMask      = ColorMaskToVkColorComponentFlags(RTBlendDesc.RenderTargetWriteMask);

    return AttachmentBlendState;
}